

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O0

WasmImport * __thiscall Js::WebAssemblyModule::GetImport(WebAssemblyModule *this,uint32 i)

{
  uint32 uVar1;
  WasmCompilationException *this_00;
  List<Wasm::WasmImport_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  Type *ppWVar2;
  uint32 i_local;
  WebAssemblyModule *this_local;
  
  uVar1 = GetImportCount(this);
  if (uVar1 <= i) {
    this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
    Wasm::WasmCompilationException::WasmCompilationException(this_00,L"Import index out of range");
    __cxa_throw(this_00,&Wasm::WasmCompilationException::typeinfo,
                Wasm::WasmCompilationException::~WasmCompilationException);
  }
  this_01 = Memory::
            WriteBarrierPtr<JsUtil::List<Wasm::WasmImport_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
            ::operator->(&this->m_imports);
  ppWVar2 = JsUtil::
            List<Wasm::WasmImport_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Item(this_01,i);
  return *ppWVar2;
}

Assistant:

Wasm::WasmImport*
WebAssemblyModule::GetImport(uint32 i) const
{
    if (i >= GetImportCount())
    {
        throw Wasm::WasmCompilationException(_u("Import index out of range"));
    }
    return m_imports->Item(i);
}